

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

size_t __thiscall
xray_re::xr_reader::find_chunk(xr_reader *this,uint32_t find_id,bool *compressed,bool reset)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  char *__assertion;
  uint *puVar5;
  
  if ((int)CONCAT71(in_register_00000009,reset) == 0) {
    puVar5 = (uint *)(this->field_2).m_p_s32;
  }
  else {
    puVar5 = (uint *)this->m_data;
    (this->field_2).m_p_s32 = (int32_t *)puVar5;
  }
  puVar3 = (uint *)this->m_end;
  while( true ) {
    if (puVar3 <= puVar5) {
      return 0;
    }
    puVar1 = puVar5 + 2;
    if (puVar3 < puVar1) break;
    (this->field_2).m_p = (uint8_t *)(puVar5 + 1);
    uVar2 = *puVar5;
    (this->field_2).m_p = (uint8_t *)puVar1;
    uVar4 = (ulong)puVar5[1];
    puVar5 = (uint *)((long)puVar1 + uVar4);
    if (puVar3 < puVar5) {
      __assertion = "m_p + size <= m_end";
      uVar2 = 0x1d;
      goto LAB_00174149;
    }
    if ((uVar2 & 0x7fffffff) == find_id) {
      if ((compressed != (bool *)0x0) || (-1 < (int)uVar2)) {
        if (compressed == (bool *)0x0) {
          return uVar4;
        }
        *compressed = SUB41(uVar2 >> 0x1f,0);
        return uVar4;
      }
      __assertion = "compressed || (id & CHUNK_COMPRESSED) == 0";
      uVar2 = 0x1f;
      goto LAB_00174149;
    }
    (this->field_2).m_p_s32 = (int32_t *)puVar5;
  }
  __assertion = "m_p + 8 <= m_end";
  uVar2 = 0x1a;
LAB_00174149:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                ,uVar2,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
}

Assistant:

size_t xr_reader::find_chunk(uint32_t find_id, bool* compressed, bool reset)
{
	if (reset)
		m_p = m_data;
	while (m_p < m_end) {
		assert(m_p + 8 <= m_end);
		uint32_t id = r_u32();
		size_t size = r_u32();
		assert(m_p + size <= m_end);
		if (find_id == (id & CHUNK_ID_MASK)) {
			xr_assert(compressed || (id & CHUNK_COMPRESSED) == 0);
			if (compressed != 0)
				*compressed = (id & CHUNK_COMPRESSED) != 0;
//			m_debug_find_chunk = m_p + size;
			return size;
		}
		m_p += size;
	}
	return 0;
}